

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O1

IterateResult __thiscall
gl3cts::SparseBuffersWithCopyOpsTest::iterate(SparseBuffersWithCopyOpsTest *this)

{
  uchar *puVar1;
  uchar *puVar2;
  ostringstream *this_00;
  uint uVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  long lVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  char *pcVar13;
  bool bVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar7;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  bVar4 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_sparse_buffer");
  bVar14 = true;
  if (bVar4) {
    bVar4 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_buffer_storage");
    bVar14 = true;
    if (bVar4) {
      bVar4 = initTest(this);
      bVar14 = false;
      if (bVar4) {
        puVar1 = this->m_reference_data;
        bVar14 = true;
        uVar3 = 0;
        do {
          uVar11 = 6;
          if (this->m_n_iterations_to_run != 0) {
            uVar10 = 0;
            do {
              if (uVar10 != 0) {
                (**(code **)(lVar7 + 0x158))(0x8892,0,this->m_page_size * this->m_n_pages_to_test,0)
                ;
                dVar6 = (**(code **)(lVar7 + 0x800))();
                glu::checkError(dVar6,"glBufferPageCommitmentARB() call failed.",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                                ,0x161b);
              }
              (**(code **)(lVar7 + 0x158))(0x8892,0,(long)this->m_page_size,1);
              dVar6 = (**(code **)(lVar7 + 0x800))();
              glu::checkError(dVar6,"glBufferPageCommitmentARB() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                              ,0x1620);
              (**(code **)(lVar7 + 0x168))(0x8892,0,0x10,puVar1);
              dVar6 = (**(code **)(lVar7 + 0x800))();
              glu::checkError(dVar6,"glBufferSubData() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                              ,0x1624);
              if (this->m_n_pages_to_test != 0) {
                uVar11 = 0;
                do {
                  (**(code **)(lVar7 + 0x158))
                            (0x8892,this->m_page_size * uVar11,(long)this->m_page_size,1);
                  dVar6 = (**(code **)(lVar7 + 0x800))();
                  glu::checkError(dVar6,"glBufferPageCommitmentARB() call failed.",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                                  ,0x162b);
                  for (iVar5 = (uint)(uVar11 == 0) << 4; iVar9 = this->m_page_size, iVar5 < iVar9;
                      iVar5 = iVar5 + 0x10) {
                    if ((uVar3 & 1) == 0) {
                      (**(code **)(lVar7 + 0x308))
                                (0x8892,0x8892,iVar5 + iVar9 * uVar11 + -0x10,iVar5 + iVar9 * uVar11
                                 ,0x10);
                      dVar6 = (**(code **)(lVar7 + 0x800))();
                      pcVar13 = "glCopyBufferSubData() call failed.";
                      iVar9 = 0x163b;
                    }
                    else {
                      (**(code **)(lVar7 + 0x168))(0x8892,iVar9 * uVar11 + iVar5,0x10,puVar1);
                      dVar6 = (**(code **)(lVar7 + 0x800))();
                      pcVar13 = "glBufferSubData() call failed.";
                      iVar9 = 0x1644;
                    }
                    glu::checkError(dVar6,pcVar13,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                                    ,iVar9);
                  }
                  uVar11 = uVar11 + 1;
                } while (uVar11 < this->m_n_pages_to_test);
              }
              (**(code **)(lVar7 + 0x308))(0x8892,0x8893,0,0,this->m_result_data_storage_size);
              dVar6 = (**(code **)(lVar7 + 0x800))();
              glu::checkError(dVar6,"glCopyBufferSubData() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                              ,0x1653);
              lVar8 = (**(code **)(lVar7 + 0xd00))
                                (0x8893,0,this->m_n_pages_to_test * this->m_page_size,1);
              dVar6 = (**(code **)(lVar7 + 0x800))();
              glu::checkError(dVar6,"glMapBufferRange() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                              ,0x1659);
              uVar11 = 0x10;
              if (0xf < this->m_result_data_storage_size) {
                lVar12 = 0;
                uVar15 = 0;
                do {
                  puVar2 = (uchar *)(lVar8 + lVar12);
                  auVar16[0] = -(*puVar1 == *puVar2);
                  auVar16[1] = -(this->m_reference_data[1] == puVar2[1]);
                  auVar16[2] = -(this->m_reference_data[2] == puVar2[2]);
                  auVar16[3] = -(this->m_reference_data[3] == puVar2[3]);
                  auVar16[4] = -(this->m_reference_data[4] == puVar2[4]);
                  auVar16[5] = -(this->m_reference_data[5] == puVar2[5]);
                  auVar16[6] = -(this->m_reference_data[6] == puVar2[6]);
                  auVar16[7] = -(this->m_reference_data[7] == puVar2[7]);
                  auVar16[8] = -(this->m_reference_data[8] == puVar2[8]);
                  auVar16[9] = -(this->m_reference_data[9] == puVar2[9]);
                  auVar16[10] = -(this->m_reference_data[10] == puVar2[10]);
                  auVar16[0xb] = -(this->m_reference_data[0xb] == puVar2[0xb]);
                  auVar16[0xc] = -(this->m_reference_data[0xc] == puVar2[0xc]);
                  auVar16[0xd] = -(this->m_reference_data[0xd] == puVar2[0xd]);
                  auVar16[0xe] = -(this->m_reference_data[0xe] == puVar2[0xe]);
                  auVar16[0xf] = -(this->m_reference_data[0xf] == puVar2[0xf]);
                  if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar16[0xf] >> 7) << 0xf) != 0xffff) {
                    local_1b0._0_8_ =
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                    this_00 = (ostringstream *)(local_1b0 + 8);
                    std::__cxx11::ostringstream::ostringstream(this_00);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,"Invalid data found for page index [",0x23);
                    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,"], BO data offset:[",0x13);
                    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"].",2);
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_1b0,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                    std::__cxx11::ostringstream::~ostringstream(this_00);
                    std::ios_base::~ios_base(local_138);
                    uVar11 = 2;
                    bVar14 = false;
                    goto LAB_00a92b37;
                  }
                  uVar15 = uVar15 + 1;
                  lVar12 = lVar12 + 0x10;
                } while (uVar15 < this->m_result_data_storage_size >> 4);
                uVar11 = 0x10;
              }
LAB_00a92b37:
              if (uVar11 == 0x10) {
                (**(code **)(lVar7 + 0x1670))(0x8893);
                dVar6 = (**(code **)(lVar7 + 0x800))();
                glu::checkError(dVar6,"glUnmapBuffer() call failed.",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                                ,0x1671);
                (**(code **)(lVar7 + 0x168))
                          (0x8893,0,this->m_result_data_storage_size,this->m_clear_buffer);
                dVar6 = (**(code **)(lVar7 + 0x800))();
                glu::checkError(dVar6,"glBufferSubData() call failed.",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                                ,0x1677);
                (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[5])();
                uVar11 = 0;
              }
            } while ((uVar11 == 0) &&
                    (uVar10 = uVar10 + 1, uVar11 = 6, uVar10 < this->m_n_iterations_to_run));
          }
          if (uVar11 != 6) goto LAB_00a92bf4;
          bVar4 = uVar3 == 0;
          uVar3 = uVar3 + 1;
        } while (bVar4);
        uVar11 = 3;
LAB_00a92bf4:
        if ((uVar11 & 0xfffffffe) != 2) {
          return STOP;
        }
      }
    }
  }
  pcVar13 = "Fail";
  if (bVar14) {
    pcVar13 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(byte)~bVar14,
             pcVar13);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult SparseBuffersWithCopyOpsTest::iterate()
{
	bool result = true;

	/* Execute the test */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Only execute if we're dealing with an OpenGL implementation which supports both:
	 *
	 * 1. GL_ARB_sparse_buffer extension
	 * 2. GL_ARB_buffer_storage extension
	 */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_buffer") ||
		!m_context.getContextInfo().isExtensionSupported("GL_ARB_buffer_storage"))
	{
		goto end;
	}

	/* Set up the test objects */
	if (!initTest())
	{
		result = false;

		goto end;
	}
	for (unsigned int n_test_case = 0; n_test_case < 2; ++n_test_case)
	{
		for (unsigned int n_iteration = 0; n_iteration < m_n_iterations_to_run; ++n_iteration)
		{
			if (n_iteration != 0)
			{
				gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, 0, /* offset */
										   m_n_pages_to_test * m_page_size, GL_FALSE);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferPageCommitmentARB() call failed.");
			}

			gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, 0, /* offset */
									   m_page_size, GL_TRUE);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferPageCommitmentARB() call failed.");

			gl.bufferSubData(GL_ARRAY_BUFFER, 0, /* offset */
							 sizeof(m_reference_data), m_reference_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferSubData() call failed.");

			for (unsigned int n_page = 0; n_page < m_n_pages_to_test; ++n_page)
			{
				/* Try committing pages in a redundant manner. This is a legal behavior in light of
				 * the GL_ARB_sparse_buffer spec */
				gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, n_page * m_page_size, m_page_size, GL_TRUE);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferPageCommitmentARB() call failed.");

				for (int copy_dst_page_offset = static_cast<int>((n_page == 0) ? sizeof(m_reference_data) : 0);
					 copy_dst_page_offset < static_cast<int>(m_page_size);
					 copy_dst_page_offset += static_cast<int>(sizeof(m_reference_data)))
				{
					const int copy_src_page_offset =
						static_cast<const int>(copy_dst_page_offset - sizeof(m_reference_data));

					switch (n_test_case)
					{
					case 0:
					{
						gl.copyBufferSubData(GL_ARRAY_BUFFER, GL_ARRAY_BUFFER,
											 n_page * m_page_size + copy_src_page_offset,
											 n_page * m_page_size + copy_dst_page_offset, sizeof(m_reference_data));
						GLU_EXPECT_NO_ERROR(gl.getError(), "glCopyBufferSubData() call failed.");

						break;
					}

					case 1:
					{
						gl.bufferSubData(GL_ARRAY_BUFFER, n_page * m_page_size + copy_dst_page_offset,
										 sizeof(m_reference_data), m_reference_data);
						GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferSubData() call failed.");

						break;
					}

					default:
						TCU_FAIL("Unrecognized test case index");
					} /* switch (n_test_case) */
				}	 /* for (all valid destination copy op offsets) */
			}		  /* for (all test pages) */

			/* Copy data from the sparse buffer to a mappable immutable buffer storage */
			gl.copyBufferSubData(GL_ARRAY_BUFFER, GL_ELEMENT_ARRAY_BUFFER, 0, /* readOffset */
								 0,											  /* writeOffset */
								 m_result_data_storage_size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCopyBufferSubData() call failed.");

			/* Map the data we have obtained */
			char* mapped_data = (char*)gl.mapBufferRange(GL_ELEMENT_ARRAY_BUFFER, 0, /* offset */
														 m_page_size * m_n_pages_to_test, GL_MAP_READ_BIT);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

			/* Verify the data is valid */
			for (unsigned int n_temp_copy = 0; n_temp_copy < m_result_data_storage_size / sizeof(m_reference_data);
				 ++n_temp_copy)
			{
				const unsigned int cmp_offset = static_cast<const unsigned int>(n_temp_copy * sizeof(m_reference_data));

				if (memcmp(mapped_data + cmp_offset, m_reference_data, sizeof(m_reference_data)) != 0)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data found for page index "
																   "["
									   << (cmp_offset / m_page_size) << "]"
																		", BO data offset:"
																		"["
									   << cmp_offset << "]." << tcu::TestLog::EndMessage;

					result = false;
					goto end;
				}
			} /* for (all datasets) */

			/* Clean up */
			gl.unmapBuffer(GL_ELEMENT_ARRAY_BUFFER);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");

			/* Also, zero out the other buffer object we copy the result data to, in case
			 * the glCopyBufferSubData() call does not modify it at all */
			gl.bufferSubData(GL_ELEMENT_ARRAY_BUFFER, 0, /* offset */
							 m_result_data_storage_size, m_clear_buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferSubData() call failed.");

			/* NOTE: This test passes fine on the misbehaving driver *if* the swapbuffers operation
			 *       issued as a part of the call below is not executed. */
			m_context.getRenderContext().postIterate();
		} /* for (all test iterations) */
	}	 /* for (all test cases) */

end:
	m_testCtx.setTestResult(result ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, result ? "Pass" : "Fail");

	return STOP;
}